

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

void __thiscall mognetwork::Selector::setFds(Selector *this)

{
  __fd_mask *p_Var1;
  int iVar2;
  uint __i;
  long lVar3;
  _List_node_base *p_Var4;
  SocketFD SVar5;
  
  this->m_maxFds = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    (this->m_rdfs).fds_bits[lVar3] = 0;
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    (this->m_wdfs).fds_bits[lVar3] = 0;
  }
  SVar5 = 0;
  p_Var4 = (_List_node_base *)&this->m_readSockets;
  while (p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var4 != (_List_node_base *)&this->m_readSockets)
  {
    iVar2 = *(int *)&p_Var4[1]._M_next;
    p_Var1 = (this->m_rdfs).fds_bits + iVar2 / 0x40;
    *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
    if (SVar5 < iVar2) {
      SVar5 = *(SocketFD *)&p_Var4[1]._M_next;
    }
    this->m_maxFds = SVar5;
  }
  p_Var4 = (_List_node_base *)&this->m_writeSockets;
  while (p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var4 != (_List_node_base *)&this->m_writeSockets)
  {
    iVar2 = *(int *)&p_Var4[1]._M_next;
    p_Var1 = (this->m_wdfs).fds_bits + iVar2 / 0x40;
    *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
    if (SVar5 < iVar2) {
      SVar5 = *(SocketFD *)&p_Var4[1]._M_next;
    }
    this->m_maxFds = SVar5;
  }
  return;
}

Assistant:

void Selector::setFds()
  {
    m_maxFds = 0;
    FD_ZERO(&m_rdfs);
    FD_ZERO(&m_wdfs);

    for (std::list<SocketFD>::iterator it = m_readSockets.begin();
	 it != m_readSockets.end(); ++it)
      {
	FD_SET(*it, &m_rdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }

    for (std::list<SocketFD>::iterator it = m_writeSockets.begin();
	 it != m_writeSockets.end(); ++it)
      {
	FD_SET(*it, &m_wdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }
  }